

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  ulong in_RAX;
  ulong uVar1;
  secp256k1_scalar sVar2;
  ulong uVar3;
  
  *r = 0;
  uVar1 = 0;
  uVar3 = 0;
  while (sVar2 = (secp256k1_scalar)uVar3, sVar2 != 0xd) {
    in_RAX = (ulong)(*x * sVar2) / 0xd;
    if ((*x * sVar2) % 0xd == 1) {
      *r = sVar2;
      uVar1 = uVar3;
    }
    uVar3 = (ulong)(sVar2 + 1);
  }
  if ((int)uVar1 != 0) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scalar_low_impl.h"
          ,0x8c,"test condition failed: *r != 0",uVar3,in_RAX);
  abort();
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    *r = 0;
    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++)
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1)
            *r = i;
    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(*r != 0);
}